

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_string_class.cpp
# Opt level: O3

void string_files(void)

{
  char cVar1;
  ostream *poVar2;
  int iVar3;
  string item;
  ifstream file_input;
  char *local_258;
  long local_250;
  char local_248 [16];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,0x127c37);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"open file successfully...\n",0x1a);
    local_258 = local_248;
    local_250 = 0;
    local_248[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_258,':');
    iVar3 = 1;
    while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_258,local_250);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      iVar3 = iVar3 + 1;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_258,':');
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done!\n",6);
    std::ifstream::close();
    if (local_258 != local_248) {
      operator_delete(local_258);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Cannot open file...\n");
}

Assistant:

void string_files() {
    using namespace std;

    //  input file stream instance
    ifstream file_input;
    file_input.open("tobuy.txt");

    if (file_input.is_open() == false) {
        //  similar to "console.error" ?
        cerr << "Cannot open file...\n";
        exit(EXIT_FAILURE); // process.exit(x)
    } else {
        //  must create the file manually...
        cout << "open file successfully...\n";
    }

    string item;
    int count = 0;
    getline(file_input, item, ':');
    while(file_input) {
        ++count; // line count, split by ':' (by default it is '\n')
        cout << count << ": " << item << endl;
        //  can this turned to "do {} while" ?
        getline(file_input, item, ':');
    }

    cout << "Done!\n";
    file_input.close();
}